

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drawable.hpp
# Opt level: O0

void __thiscall sf::Drawable::Drawable(Drawable *this,Drawable *param_1)

{
  Drawable *param_1_local;
  Drawable *this_local;
  
  this->_vptr_Drawable = (_func_int **)&PTR__Drawable_002bb9e0;
  return;
}

Assistant:

class SFML_GRAPHICS_API Drawable
{
public:

    ////////////////////////////////////////////////////////////
    /// \brief Virtual destructor
    ///
    ////////////////////////////////////////////////////////////
    virtual ~Drawable() {}

protected:

    friend class RenderTarget;

    ////////////////////////////////////////////////////////////
    /// \brief Draw the object to a render target
    ///
    /// This is a pure virtual function that has to be implemented
    /// by the derived class to define how the drawable should be
    /// drawn.
    ///
    /// \param target Render target to draw to
    /// \param states Current render states
    ///
    ////////////////////////////////////////////////////////////
    virtual void draw(RenderTarget& target, RenderStates states) const = 0;
}